

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fan_calculator.cpp
# Opt level: O2

void mahjong::adjust_by_suits(tile_t *tiles,intptr_t tile_cnt,fan_table_t *fan_table)

{
  byte bVar1;
  bool bVar2;
  uint16_t uVar3;
  long lVar4;
  long lVar5;
  
  bVar1 = 0;
  lVar4 = 0;
  if (0 < tile_cnt) {
    lVar4 = tile_cnt;
  }
  for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 1) {
    bVar1 = bVar1 | (byte)(1 << (tiles[lVar5] >> 4));
  }
  if ((bVar1 & 0xf1) == 0) {
    (*fan_table)[0x4c] = 1;
  }
  if ((bVar1 & 0xe3) == 0) {
    (*fan_table)[0x4b] = (*fan_table)[0x4b] + 1;
  }
  if ((bVar1 & 0xe5) == 0) {
    (*fan_table)[0x4b] = (*fan_table)[0x4b] + 1;
  }
  uVar3 = (*fan_table)[0x4b];
  if ((bVar1 & 0xe9) == 0) {
    uVar3 = uVar3 + 1;
    (*fan_table)[0x4b] = uVar3;
  }
  if (uVar3 == 2) {
    (*fan_table)[0x4b] = 0;
    lVar4 = 0x62;
    if ((bVar1 & 0xf1) == 0) {
      lVar4 = 0x2c;
    }
    *(undefined2 *)((long)*fan_table + lVar4) = 1;
  }
  if (bVar1 == 0x1e) {
    bVar2 = std::any_of<unsigned_char_const*,bool(*)(unsigned_char)>
                      (tiles,tiles + tile_cnt,is_winds);
    if (bVar2) {
      bVar2 = std::any_of<unsigned_char_const*,bool(*)(unsigned_char)>
                        (tiles,tiles + tile_cnt,is_dragons);
      if (bVar2) {
        (*fan_table)[0x33] = 1;
      }
    }
  }
  return;
}

Assistant:

static void adjust_by_suits(const tile_t *tiles, intptr_t tile_cnt, fan_table_t &fan_table) {
    // 打表标记有哪些花色，用bit操作
    uint8_t suit_flag = 0;
    for (intptr_t i = 0; i < tile_cnt; ++i) {
        suit_flag |= (1 << tile_get_suit(tiles[i]));
    }

    // 1111 0001
    if (!(suit_flag & 0xF1U)) {
        fan_table[NO_HONORS] = 1;  // 无字
    }

    // 1110 0011
    if (!(suit_flag & 0xE3U)) {
        ++fan_table[ONE_VOIDED_SUIT];  // 缺一门（万）
    }
    // 1110 0101
    if (!(suit_flag & 0xE5U)) {
        ++fan_table[ONE_VOIDED_SUIT];  // 缺一门（条）
    }
    // 1110 1001
    if (!(suit_flag & 0xE9U)) {
        ++fan_table[ONE_VOIDED_SUIT];  // 缺一门（饼）
    }

    // 当缺2门时，根据有字和无字，修正为混一色和清一色
    if (fan_table[ONE_VOIDED_SUIT] == 2) {
        fan_table[ONE_VOIDED_SUIT] = 0;
        fan_table[suit_flag & 0xF1U ? HALF_FLUSH : FULL_FLUSH] = 1;
    }

    // 0001 1110
    if (suit_flag == 0x1EU) {  // 三门数牌和字牌都有
        if (std::any_of(tiles, tiles + tile_cnt, &is_winds)
            && std::any_of(tiles, tiles + tile_cnt, &is_dragons)) {
            fan_table[ALL_TYPES] = 1;  // 五门齐
        }
    }
}